

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O0

nh_bool get_option_value(win_menu *mdat,wchar_t idx)

{
  nh_opttype nVar1;
  int iVar2;
  char cVar3;
  undefined1 local_348 [4];
  wchar_t prev_optstyle;
  char strbuf [256];
  wchar_t id;
  wchar_t listid;
  nh_option_desc *optlist;
  nh_option_desc *option;
  nh_optvalue value;
  char query [256];
  char buf [256];
  wchar_t idx_local;
  win_menu *mdat_local;
  
  iVar2 = settings.optstyle;
  strbuf._252_4_ = mdat->items[idx].id >> 10;
  strbuf._248_4_ = mdat->items[idx].id & 0x1ff;
  switch(strbuf._252_4_) {
  case 1:
    _id = (nh_option_desc *)nh_get_options();
    break;
  case 2:
    _id = (nh_option_desc *)nh_get_options();
    break;
  case 3:
    _id = (nh_option_desc *)nh_get_options();
    break;
  case 4:
    _id = curses_options;
    break;
  default:
    return '\0';
  }
  _id = _id + (int)strbuf._248_4_;
  option = (nh_option_desc *)local_348;
  nVar1 = _id->type;
  if (nVar1 == OPTTYPE_BOOL) {
    select_boolean_value((nh_optvalue *)&option,_id);
  }
  else if (nVar1 == OPTTYPE_INT) {
    sprintf(&value.b,"New value for %s (number from %d to %d)",_id->name,
            (ulong)(uint)(_id->field_4).i.min,(ulong)(uint)(_id->field_4).i.max);
    sprintf(query + 0xf8,"%d",(ulong)option & 0xffffffff);
    curses_getline(&value.b,query + 0xf8);
    if (query[0xf8] == '\x1b') {
      return '\0';
    }
    __isoc99_sscanf(query + 0xf8,"%d",&option);
  }
  else if (nVar1 == OPTTYPE_ENUM) {
    select_enum_value((nh_optvalue *)&option,_id);
  }
  else {
    if (nVar1 != OPTTYPE_STRING) {
      if (nVar1 == OPTTYPE_AUTOPICKUP_RULES) {
        show_autopickup_menu(_id);
        return '\0';
      }
      if (nVar1 != OPTTYPE_MSGTYPE) {
        if (nVar1 != 1000) {
          return '\0';
        }
        show_keymap_menu('\0');
        return '\0';
      }
      show_msgtype_menu(_id);
      return '\0';
    }
    sprintf(&value.b,"New value for %s (text)",_id->name);
    curses_getline(&value.b,(char *)option);
    if (*(char *)&option->name == '\x1b') {
      return '\0';
    }
  }
  cVar3 = nh_set_option(_id->name,option,0);
  if (cVar3 == '\0') {
    sprintf(local_348,"new value for %s rejected",_id->name);
    curses_msgwin(local_348);
  }
  else {
    print_option_string(_id,mdat->items[idx].caption);
  }
  return settings.optstyle != iVar2;
}

Assistant:

static nh_bool get_option_value(struct win_menu *mdat, int idx)
{
    char buf[BUFSZ], query[BUFSZ];
    union nh_optvalue value;
    struct nh_option_desc *option, *optlist;
    int listid = mdat->items[idx].id >> 10;
    int id = mdat->items[idx].id & 0x1ff;
    char strbuf[BUFSZ];
    int prev_optstyle = settings.optstyle;
    
    switch (listid) {
	case ACT_BIRTH_OPTS:
	    optlist = nh_get_options(ACTIVE_BIRTH_OPTIONS); break;
	case CUR_BIRTH_OPTS:
	    optlist = nh_get_options(CURRENT_BIRTH_OPTIONS); break;
	case GAME_OPTS:
	    optlist = nh_get_options(GAME_OPTIONS); break;
	case UI_OPTS:
	    optlist = curses_options; break;
	    
	default:
	    return FALSE;
    }
    
    option = &optlist[id];
    value.s = strbuf;
    
    switch ((int)option->type) {
	case OPTTYPE_BOOL:
	    select_boolean_value(&value, option);
	    break;
	    
	case OPTTYPE_INT:
	    sprintf(query, "New value for %s (number from %d to %d)",
		    option->name, option->i.min, option->i.max);
	    sprintf(buf, "%d", value.i);
	    curses_getline(query, buf);
	    if (buf[0] == '\033')
		return FALSE;
	    sscanf(buf, "%d", &value.i);
	    break;
	    
	case OPTTYPE_ENUM:
	    select_enum_value(&value, option);
	    break;
	    
	case OPTTYPE_STRING:
	    sprintf(query, "New value for %s (text)", option->name);
	    curses_getline(query, value.s);
	    if (value.s[0] == '\033')
		return FALSE;
	    break;
	    
	case OPTTYPE_AUTOPICKUP_RULES:
	    show_autopickup_menu(option);
	    return FALSE;
	    
	case OPTTYPE_MSGTYPE:
	    show_msgtype_menu(option);
	    return FALSE;
	    
	case OPTTYPE_KEYMAP:
	    show_keymap_menu(FALSE);
	    return FALSE;
	    
	default:
	    return FALSE;
    }
    
    if (!nh_set_option(option->name, value, FALSE)) {
	sprintf(strbuf, "new value for %s rejected", option->name);
	curses_msgwin(strbuf);
    } else
	print_option_string(option, mdat->items[idx].caption);
    
    /* special case: directly redo option menu appearance */
    if (settings.optstyle != prev_optstyle)
	return TRUE;
    
    return FALSE;
}